

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O2

void __thiscall FCajunMaster::TryAddBot(FCajunMaster *this,BYTE **stream,int player)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BYTE *info;
  botinfo_t *pbVar5;
  botskill_t skill;
  
  iVar2 = ReadByte(stream);
  info = (BYTE *)ReadString(stream);
  iVar3 = ReadByte(stream);
  iVar4 = ReadByte(stream);
  skill.perfection = iVar4;
  skill.aiming = iVar3;
  iVar3 = ReadByte(stream);
  iVar4 = ReadByte(stream);
  skill.isp = iVar4;
  skill.reaction = iVar3;
  if (consoleplayer == player) {
    pbVar5 = (botinfo_t *)&this->botinfo;
    iVar2 = iVar2 + 1;
    do {
      pbVar5 = pbVar5->next;
      iVar2 = iVar2 + -1;
    } while (0 < iVar2);
  }
  else {
    pbVar5 = (botinfo_t *)0x0;
  }
  bVar1 = DoAddBot((FCajunMaster *)stream,info,skill);
  if (bVar1) {
    this->botnum = this->botnum + 1;
    if (pbVar5 == (botinfo_t *)0x0) goto LAB_0036a37d;
    iVar2 = 2;
  }
  else {
    iVar2 = 0;
    if (pbVar5 == (botinfo_t *)0x0) goto LAB_0036a37d;
  }
  pbVar5->inuse = iVar2;
LAB_0036a37d:
  if (info == (BYTE *)0x0) {
    return;
  }
  operator_delete__(info);
  return;
}

Assistant:

void FCajunMaster::TryAddBot (BYTE **stream, int player)
{
	int botshift = ReadByte (stream);
	char *info = ReadString (stream);
	botskill_t skill;
	skill.aiming = ReadByte (stream);
	skill.perfection = ReadByte (stream);
	skill.reaction = ReadByte (stream);
	skill.isp = ReadByte (stream);

	botinfo_t *thebot = NULL;

	if (consoleplayer == player)
	{
		thebot = botinfo;

		while (botshift > 0)
		{
			thebot = thebot->next;
			botshift--;
		}
	}

	if (DoAddBot ((BYTE *)info, skill))
	{
		//Increment this.
		botnum++;

		if (thebot != NULL)
		{
			thebot->inuse = BOTINUSE_Yes;
		}
	}
	else
	{
		if (thebot != NULL)
		{
			thebot->inuse = BOTINUSE_No;
		}
	}

	delete[] info;
}